

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fake_network.cxx
# Opt level: O1

ssize_t __thiscall
nuraft::FakeClient::send(FakeClient *this,int __fd,void *__buf,size_t __n,int __flags)

{
  size_t *psVar1;
  FakeNetwork *pFVar2;
  SimpleLogger *this_00;
  pointer pcVar3;
  undefined8 uVar4;
  undefined1 *puVar5;
  bool bVar6;
  _List_node_base *p_Var7;
  undefined7 extraout_var;
  _List_node_base *extraout_RAX;
  msg_type type;
  undefined4 in_register_00000034;
  undefined4 in_register_00000084;
  undefined1 local_a8 [32];
  _List_node_base *local_88;
  _List_node_base *p_Stack_80;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  string local_50;
  
  pFVar2 = this->motherNet;
  this_00 = ((pFVar2->base).super___shared_ptr<nuraft::FakeNetworkBase,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->myLog;
  if ((this_00 != (SimpleLogger *)0x0) && (3 < (this_00->curLogLevel).super___atomic_base<int>._M_i)
     ) {
    local_a8._0_8_ = local_a8 + 0x10;
    pcVar3 = (pFVar2->myEndpoint)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_a8,pcVar3,pcVar3 + (pFVar2->myEndpoint)._M_string_length,
               local_a8._0_8_,CONCAT44(in_register_00000084,__flags));
    uVar4 = local_a8._0_8_;
    local_70[0] = local_60;
    pcVar3 = (this->dstNet->myEndpoint)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_70,pcVar3,pcVar3 + (this->dstNet->myEndpoint)._M_string_length);
    puVar5 = local_70[0];
    msg_type_to_string_abi_cxx11_
              (&local_50,
               (nuraft *)
               (ulong)(((((ptr<req_msg> *)CONCAT44(in_register_00000034,__fd))->
                        super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                      super_msg_base).type_,type);
    SimpleLogger::put(this_00,4,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/fake_network.cxx"
                      ,"send",0x135,"got request %s -> %s, %s",uVar4,puVar5,
                      local_50._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if (local_70[0] != local_60) {
      operator_delete(local_70[0]);
    }
    if ((element_type *)local_a8._0_8_ != (element_type *)(local_a8 + 0x10)) {
      operator_delete((void *)local_a8._0_8_);
    }
  }
  FakeNetwork::ReqPkg::ReqPkg
            ((ReqPkg *)local_a8,(ptr<req_msg> *)CONCAT44(in_register_00000034,__fd),
             (rpc_handler *)__buf);
  p_Var7 = (_List_node_base *)operator_new(0x40);
  uVar4 = local_a8._8_8_;
  p_Var7[1]._M_prev = (_List_node_base *)0x0;
  local_a8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var7[1]._M_next = (_List_node_base *)local_a8._0_8_;
  p_Var7[1]._M_prev = (_List_node_base *)uVar4;
  local_a8._0_8_ = (element_type *)0x0;
  p_Var7[3]._M_next = (_List_node_base *)0x0;
  p_Var7[2]._M_next = (_List_node_base *)0x0;
  p_Var7[2]._M_prev = (_List_node_base *)0x0;
  p_Var7[3]._M_prev = p_Stack_80;
  if (local_88 != (_List_node_base *)0x0) {
    p_Var7[2]._M_next = (_List_node_base *)local_a8._16_8_;
    p_Var7[2]._M_prev = (_List_node_base *)local_a8._24_8_;
    p_Var7[3]._M_next = local_88;
    local_88 = (_List_node_base *)0x0;
    p_Stack_80 = (_List_node_base *)0x0;
  }
  std::__detail::_List_node_base::_M_hook(p_Var7);
  psVar1 = &(this->pendingReqs).
            super__List_base<nuraft::FakeNetwork::ReqPkg,_std::allocator<nuraft::FakeNetwork::ReqPkg>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  p_Var7 = local_88;
  if (local_88 != (_List_node_base *)0x0) {
    bVar6 = (*(code *)local_88)((_Any_data *)(local_a8 + 0x10),(_Any_data *)(local_a8 + 0x10),
                                __destroy_functor);
    p_Var7 = (_List_node_base *)CONCAT71(extraout_var,bVar6);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
    p_Var7 = extraout_RAX;
  }
  return (ssize_t)p_Var7;
}

Assistant:

void FakeClient::send(ptr<req_msg>& req,
                      rpc_handler& when_done,
                      uint64_t /*send_timeout_ms*/)
{
    SimpleLogger* ll = motherNet->getBase()->getLogger();
    _log_info(ll, "got request %s -> %s, %s",
              motherNet->getEndpoint().c_str(),
              dstNet->getEndpoint().c_str(),
              msg_type_to_string( req->get_type() ).c_str() );
    pendingReqs.push_back( FakeNetwork::ReqPkg(req, when_done) );
}